

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O3

void __thiscall
Potassco::StringBuilder::StringBuilder(StringBuilder *this,char *buf,size_t n,Mode m)

{
  char *pcVar1;
  
  pcVar1 = (this->field_0).sbo_ + 0x3d;
  if (n != 0) {
    pcVar1 = buf;
  }
  (this->field_0).buf_.head = pcVar1;
  *pcVar1 = '\0';
  (this->field_0).buf_.used = 0;
  (this->field_0).buf_.size = (n - 1) + (ulong)(n == 0);
  (this->field_0).sbo_[0x3f] = m == Fixed ^ 0x81;
  return;
}

Assistant:

StringBuilder::StringBuilder(char* buf, std::size_t n, Mode m) {
	if (!n) { buf = sbo_ + (SboCap - 2); n = 1; }
	*(buf_.head = buf) = 0;
	buf_.used = 0;
	buf_.size = n - 1;
	setTag(m == Fixed ? Buf : Buf|Own);
}